

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O1

void __thiscall
VW::config::options_serializer_boost_po::serialize<unsigned_long>
          (options_serializer_boost_po *this,typed_option<unsigned_long> *typed_option)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x18," --",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x18,
                      (typed_option->super_base_option).m_name._M_dataplus._M_p,
                      (typed_option->super_base_option).m_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  return;
}

Assistant:

void serialize(typed_option<T> typed_option)
  {
    m_output_stream << " --" << typed_option.m_name << " " << typed_option.value();
  }